

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_local_scale(REF_DBL *metric,REF_GRID ref_grid,REF_INT p_norm)

{
  int iVar1;
  REF_NODE pRVar2;
  double dVar3;
  uint uVar4;
  ulong uVar5;
  REF_DBL *pRVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  REF_DBL det;
  double local_48;
  REF_GRID local_40;
  double local_38;
  
  pRVar2 = ref_grid->node;
  iVar1 = ref_grid->twod;
  if (iVar1 != 0) {
    uVar8 = 0;
    uVar5 = (ulong)(uint)pRVar2->max;
    if (pRVar2->max < 1) {
      uVar5 = uVar8;
    }
    pRVar6 = metric + 4;
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      if (-1 < pRVar2->global[uVar8]) {
        pRVar6[-2] = 0.0;
        *(undefined4 *)pRVar6 = 0;
        *(undefined4 *)((long)pRVar6 + 4) = 0;
        *(undefined4 *)(pRVar6 + 1) = 0;
        *(undefined4 *)((long)pRVar6 + 0xc) = 0x3ff00000;
      }
      pRVar6 = pRVar6 + 6;
    }
  }
  local_38 = -1.0 / (double)(int)((iVar1 == 0 | 2) + p_norm * 2);
  lVar7 = 0;
  pRVar6 = metric;
  local_40 = ref_grid;
  do {
    uVar4 = pRVar2->max;
    if ((int)uVar4 <= lVar7) {
      if (local_40->twod != 0) {
        uVar5 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar5 = 0;
        }
        pRVar6 = metric + 4;
        for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
          if (-1 < pRVar2->global[uVar8]) {
            pRVar6[-2] = 0.0;
            *(undefined4 *)pRVar6 = 0;
            *(undefined4 *)((long)pRVar6 + 4) = 0;
            *(undefined4 *)(pRVar6 + 1) = 0;
            *(undefined4 *)((long)pRVar6 + 0xc) = 0x3ff00000;
          }
          pRVar6 = pRVar6 + 6;
        }
      }
      return 0;
    }
    if (-1 < pRVar2->global[lVar7]) {
      uVar4 = ref_matrix_det_m(metric + lVar7 * 6,&local_48);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa2e,"ref_metric_local_scale",(ulong)uVar4,"det_m local hess scale");
        return uVar4;
      }
      if (0.0 < local_48) {
        for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
          dVar3 = pow(local_48,local_38);
          pRVar6[lVar9] = dVar3 * pRVar6[lVar9];
        }
      }
    }
    lVar7 = lVar7 + 1;
    pRVar6 = pRVar6 + 6;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_local_scale(REF_DBL *metric, REF_GRID ref_grid,
                                          REF_INT p_norm) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_INT dimension;
  REF_DBL det, exponent;

  dimension = 3;
  if (ref_grid_twod(ref_grid)) {
    dimension = 2;
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  /* local scaling */
  exponent = -1.0 / ((REF_DBL)(2 * p_norm + dimension));
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_det_m(&(metric[6 * node]), &det), "det_m local hess scale");
    if (det > 0.0) {
      for (i = 0; i < 6; i++) metric[i + 6 * node] *= pow(det, exponent);
    }
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}